

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O1

double __thiscall
LargeGapGrayCode::computeGapVariance
          (LargeGapGrayCode *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *runLengths)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  int iVar4;
  const_iterator it;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  p_Var2 = (runLengths->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(runLengths->_M_t)._M_impl.super__Rb_tree_header;
  dVar7 = 0.0;
  dVar8 = 0.0;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    iVar5 = 0;
    iVar4 = 0;
    p_Var1 = p_Var2;
    do {
      iVar5 = iVar5 + p_Var1[1]._M_color * *(int *)&p_Var1[1].field_0x4;
      iVar4 = iVar4 + *(int *)&p_Var1[1].field_0x4;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
    dVar8 = (double)iVar5;
    dVar7 = (double)iVar4;
  }
  dVar6 = 0.0;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    iVar4 = 0;
    do {
      dVar6 = (double)(int)p_Var2[1]._M_color - dVar8 / dVar7;
      iVar4 = (int)((double)iVar4 + (double)*(int *)&p_Var2[1].field_0x4 * dVar6 * dVar6);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    dVar6 = (double)iVar4;
  }
  return dVar6 / dVar7;
}

Assistant:

double LargeGapGrayCode::computeGapVariance(const std::map<int, int>& runLengths)
{
	int sum = 0;
	int runs = 0;

	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		sum += it->first * it->second;
		runs += it->second;
	}

	double mean = (double)sum/runs;

	int squaredDiff = 0;
	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		squaredDiff += (it->first-mean)*(it->first-mean) * it->second;
	}

	double variance = (double)squaredDiff/runs;

	return variance;
}